

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

json_type __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::type
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_type jVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  json_runtime_error<std::runtime_error,_void> *this_01;
  string_view_type sVar2;
  string_view_type sVar3;
  type tVar4;
  error_code eVar5;
  allocator<char> aaStack_38 [8];
  string sStack_30;
  
  jVar1 = (byte)(this->field_0).json_const_pointer_ & (array_value|byte_string_value);
  switch(jVar1) {
  case half_value:
  case array_value|double_value:
switchD_003313d0_caseD_4:
    jVar1 = object_value;
    break;
  case string_value:
switchD_003313d0_caseD_6:
    return half_value;
  case byte_string_value:
  case array_value|byte_string_value:
switchD_003313d0_caseD_7:
    return string_value;
  case array_value:
  case object_value:
switchD_003313d0_caseD_8:
    this = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
            &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
             field_0x8;
    jVar1 = (json_type)
            (((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ &
            (array_value|byte_string_value);
    switch(jVar1) {
    default:
      break;
    case half_value:
    case array_value|double_value:
      goto switchD_003313d0_caseD_4;
    case string_value:
      goto switchD_003313d0_caseD_6;
    case byte_string_value:
    case array_value|byte_string_value:
      goto switchD_003313d0_caseD_7;
    case array_value:
    case object_value:
      goto switchD_003313d0_caseD_8;
    case array_value|int64_value:
    case array_value|uint64_value:
      goto 
      jsoncons_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_as_integer<long>;
    case array_value|half_value:
      goto switchD_003313d0_caseD_c;
    case array_value|string_value:
      goto switchD_003313d0_caseD_e;
    }
  case array_value|int64_value:
  case array_value|uint64_value:
jsoncons_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_as_integer<long>:
    do {
      switch((byte)((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                     *)&((pointer)this)->
                        super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
                   json_const_pointer_ & 0xf) {
      case 1:
        return *(json_type *)
                ((long)&(((pointer)this)->
                        super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ + 2);
      case 2:
      case 3:
        return (json_type)
               *(undefined8 *)
                &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
                 field_0x8;
      default:
        this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_30,"Not an integer",aaStack_38);
        json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&sStack_30);
        __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                    json_runtime_error<std::domain_error,_void>::~json_runtime_error);
      case 5:
        return (json_type)
               (long)*(double *)
                      &(((pointer)this)->
                       super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8;
      case 6:
        return (json_type)
               *(undefined2 *)
                ((long)&(((pointer)this)->
                        super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ + 2);
      case 7:
      case 0xf:
        sVar2 = as_string_view(this);
        sVar3 = as_string_view(this);
        tVar4 = detail::to_integer<long,wchar_t>(sVar2._M_str,sVar3._M_len,(long *)aaStack_38);
        if (tVar4.ec == success) {
          return (json_type)aaStack_38[0];
        }
        this_01 = (json_runtime_error<std::runtime_error,_void> *)__cxa_allocate_exception(0x18);
        eVar5 = detail::make_error_code(tVar4.ec);
        (**(code **)(*(long *)eVar5._M_cat + 0x20))(&sStack_30,eVar5._M_cat,eVar5._M_value);
        json_runtime_error<std::runtime_error,_void>::json_runtime_error(this_01,&sStack_30);
        __cxa_throw(this_01,&json_runtime_error<std::runtime_error,void>::typeinfo,
                    json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
      case 8:
      case 9:
        this = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               (((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                  *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)
               ->byte_str_).ptr_;
      }
    } while( true );
  case array_value|half_value:
switchD_003313d0_caseD_c:
    return byte_string_value;
  case array_value|string_value:
switchD_003313d0_caseD_e:
    return array_value;
  }
  return jVar1;
}

Assistant:

json_type type() const
        {
            switch(storage_kind())
            {
                case json_storage_kind::null:
                    return json_type::null_value;
                case json_storage_kind::boolean:
                    return json_type::bool_value;
                case json_storage_kind::int64:
                    return json_type::int64_value;
                case json_storage_kind::uint64:
                    return json_type::uint64_value;
                case json_storage_kind::half_float:
                    return json_type::half_value;
                case json_storage_kind::float64:
                    return json_type::double_value;
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return json_type::string_value;
                case json_storage_kind::byte_str:
                    return json_type::byte_string_value;
                case json_storage_kind::array:
                    return json_type::array_value;
                case json_storage_kind::empty_object:
                case json_storage_kind::object:
                    return json_type::object_value;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().type();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().type();
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }